

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_impl.hpp
# Opt level: O3

ostream * toml::operator<<(ostream *os,time_offset *offset)

{
  ostream *poVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  char local_1c [4];
  
  if (offset->hour == '\0' && offset->minute == '\0') {
    local_1c[0] = 'Z';
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1c,1);
  }
  else {
    uVar3 = offset->hour * 0x3c + (int)offset->minute;
    if ((int)uVar3 < 0) {
      local_1c[1] = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 1,1);
      uVar3 = -uVar3;
    }
    else {
      local_1c[2] = 0x2b;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1c + 2,1);
    }
    lVar2 = *(long *)os;
    poVar1 = os + *(long *)(lVar2 + -0x18);
    if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar2 = *(long *)os;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    uVar4 = (uVar3 & 0xffff) / 0x3c;
    poVar1 = (ostream *)std::ostream::operator<<(os,uVar4);
    local_1c[3] = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c + 3,1);
    lVar2 = *(long *)os;
    poVar1 = os + *(long *)(lVar2 + -0x18);
    if (os[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar2 = *(long *)os;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    std::ostream::operator<<(os,uVar3 + uVar4 * -0x3c & 0xffff);
  }
  return os;
}

Assistant:

TOML11_INLINE std::ostream& operator<<(std::ostream& os, const time_offset& offset)
{
    if(offset.hour == 0 && offset.minute == 0)
    {
        os << 'Z';
        return os;
    }
    int minute = static_cast<int>(offset.hour) * 60 + offset.minute;
    if(minute < 0){os << '-'; minute = std::abs(minute);} else {os << '+';}
    os << std::setfill('0') << std::setw(2) << minute / 60 << ':';
    os << std::setfill('0') << std::setw(2) << minute % 60;
    return os;
}